

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

TestInfo * __thiscall testing::UnitTest::current_test_info(UnitTest *this)

{
  TestInfo *pTVar1;
  GTestMutexLock local_20;
  MutexLock lock;
  
  local_20.mutex_ = &(this->mutex_).super_MutexBase;
  internal::MutexBase::Lock(local_20.mutex_);
  pTVar1 = this->impl_->current_test_info_;
  internal::GTestMutexLock::~GTestMutexLock(&local_20);
  return pTVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(mutex_) {
  internal::MutexLock lock(&mutex_);
  return impl_->current_test_info();
}